

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall IRBuilderAsmJs::BuildEmpty(IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset)

{
  Func *pFVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  Which WVar5;
  AsmJsType asmType;
  RegSlot RVar6;
  JitArenaAllocator *instr;
  Instr *instr_00;
  IndirOpnd *this_00;
  undefined4 *puVar7;
  RegOpnd *pRVar8;
  IRType IVar9;
  undefined6 in_register_00000032;
  IRBuilderAsmJs *this_01;
  int iVar10;
  undefined1 local_48 [6];
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  uint32 uStack_40;
  undefined4 uStack_3c;
  ValueType vType;
  IRType local_31 [8];
  IRType irType;
  
  Js::ByteCodeReader::Empty(&this->m_jnReader);
  iVar10 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (0x12 < iVar10) {
    if (iVar10 == 0x10b) {
      instr_00 = IR::Instr::New(ThrowRuntimeError,this->m_func);
      this_00 = (IndirOpnd *)IR::IntConstOpnd::New(0x1b59,TyInt32,instr_00->m_func,false);
      if (instr_00->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar4) goto LAB_004fa537;
        *puVar7 = 0;
      }
    }
    else {
      if (iVar10 != 0x13) goto LAB_004fa1ab;
      instr_00 = IR::Instr::New(ArrayDetachedCheck,this->m_func);
      pRVar8 = BuildSrcOpnd(this,2,TyVar);
      this_00 = IR::IndirOpnd::New(pRVar8,0x20,TyInt8,this->m_func,false);
      if (instr_00->m_src1 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
        if (!bVar4) goto LAB_004fa537;
        *puVar7 = 0;
      }
    }
    pFVar1 = instr_00->m_func;
    if ((this_00->super_Opnd).isDeleted == true) {
      _uStack_40 = (JitArenaAllocator *)CONCAT44(uStack_3c,offset);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_004fa537;
      *puVar7 = 0;
      offset = uStack_40;
    }
    bVar3 = (this_00->super_Opnd).field_0xb;
    if ((bVar3 & 2) != 0) {
      this_00 = (IndirOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
      bVar3 = (this_00->super_Opnd).field_0xb;
    }
    (this_00->super_Opnd).field_0xb = bVar3 | 2;
    instr_00->m_src1 = &this_00->super_Opnd;
    AddInstr(this,instr_00,offset);
    return;
  }
  if (iVar10 == 7) {
    return;
  }
  if (iVar10 != 8) {
LAB_004fa1ab:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x4a2,"((0))","(0)");
    if (bVar4) {
      *puVar7 = 0;
      return;
    }
    goto LAB_004fa537;
  }
  instr = (JitArenaAllocator *)IR::Instr::New(Ret,this->m_func);
  WVar5 = AsmJsJITInfo::GetRetType(this->m_asmFuncInfo);
  switch(WVar5) {
  case Int64:
    RVar6 = GetRegSlotFromTypedReg(this,0,INT64);
    IVar9 = TyInt64;
    break;
  case Double:
    RVar6 = GetRegSlotFromTypedReg(this,0,FLOAT64);
    IVar9 = TyFloat64;
    goto LAB_004fa411;
  case Float:
    RVar6 = GetRegSlotFromTypedReg(this,0,FLOAT32);
    IVar9 = TyFloat32;
LAB_004fa411:
    pRVar8 = BuildDstOpnd(this,RVar6,IVar9);
    local_42.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
    goto LAB_004fa426;
  case 4:
  case 5:
  case 6:
  case Floatish:
  case 8:
  case Fixnum:
switchD_004fa0cb_caseD_4:
    ValueType::ValueType((ValueType *)&local_42.field_0);
    WVar5 = AsmJsJITInfo::GetRetType(this->m_asmFuncInfo);
    this_01 = (IRBuilderAsmJs *)local_48;
    Js::AsmJsRetType::AsmJsRetType((AsmJsRetType *)this_01,WVar5);
    asmType = Js::AsmJsRetType::toType((AsmJsRetType *)this_01);
    GetSimdTypesFromAsmType(this_01,asmType.which_,local_31,(ValueType *)&local_42.field_0);
    RVar6 = GetRegSlotFromTypedReg(this,0,SIMD);
    pRVar8 = BuildDstOpnd(this,RVar6,local_31[0]);
    goto LAB_004fa426;
  case Signed:
    RVar6 = GetRegSlotFromTypedReg(this,0,INT32);
    IVar9 = TyInt32;
    break;
  default:
    if (WVar5 != Void) goto switchD_004fa0cb_caseD_4;
    pRVar8 = (RegOpnd *)0x0;
    goto LAB_004fa42b;
  }
  pRVar8 = BuildDstOpnd(this,RVar6,IVar9);
  local_42.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::GetInt(false);
LAB_004fa426:
  IR::Opnd::SetValueType(&pRVar8->super_Opnd,(ValueType)local_42.field_0);
LAB_004fa42b:
  if (pRVar8 != (RegOpnd *)0x0) {
    if ((Opnd *)(instr->super_ArenaAllocator).
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.largestHole
        != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_004fa537;
      *puVar7 = 0;
    }
    pFVar1 = (Func *)(instr->super_ArenaAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     super_ArenaData.mallocBlocks;
    if ((pRVar8->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      _uStack_40 = instr;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) {
LAB_004fa537:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
      instr = _uStack_40;
    }
    bVar3 = (pRVar8->super_Opnd).field_0xb;
    if ((bVar3 & 2) != 0) {
      pRVar8 = (RegOpnd *)IR::Opnd::Copy(&pRVar8->super_Opnd,pFVar1);
      bVar3 = (pRVar8->super_Opnd).field_0xb;
    }
    (pRVar8->super_Opnd).field_0xb = bVar3 | 2;
    (instr->super_ArenaAllocator).
    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.largestHole =
         (size_t)pRVar8;
  }
  AddInstr(this,(Instr *)instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildEmpty(Js::OpCodeAsmJs newOpcode, uint32 offset)
{
    m_jnReader.Empty();

    IR::Instr * instr = nullptr;
    IR::RegOpnd * regOpnd = nullptr;
    Js::RegSlot retSlot;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::CheckHeap:
        instr = IR::Instr::New(Js::OpCode::ArrayDetachedCheck, m_func);
        instr->SetSrc1(IR::IndirOpnd::New(BuildSrcOpnd(AsmJsRegSlots::ArrayReg, TyVar), Js::ArrayBuffer::GetIsDetachedOffset(), TyInt8, m_func));
        AddInstr(instr, offset);
        break;
    case Js::OpCodeAsmJs::Unreachable_Void:
        instr = IR::Instr::New(Js::OpCode::ThrowRuntimeError, m_func);
        instr->SetSrc1(IR::IntConstOpnd::New(SCODE_CODE(WASMERR_Unreachable), TyInt32, instr->m_func));
        AddInstr(instr, offset);
        break;
    case Js::OpCodeAsmJs::Ret:
        instr = IR::Instr::New(Js::OpCode::Ret, m_func);

        switch (m_asmFuncInfo->GetRetType())
        {
        case Js::AsmJsRetType::Which::Signed:
            retSlot = GetRegSlotFromIntReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyInt32);
            regOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Float:
            retSlot = GetRegSlotFromFloatReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyFloat32);
            regOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Double:
            retSlot = GetRegSlotFromDoubleReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyFloat64);
            regOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsVarType::Which::Int64:
            retSlot = GetRegSlotFromInt64Reg(0);
            regOpnd = BuildDstOpnd(retSlot, TyInt64);
            regOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Void:
            break;

        default:
        {
            IRType irType;
            ValueType vType;
            GetSimdTypesFromAsmType(Js::AsmJsRetType(m_asmFuncInfo->GetRetType()).toType().GetWhich(), &irType, &vType);
            retSlot = GetRegSlotFromSimd128Reg(0);
            regOpnd = BuildDstOpnd(retSlot, irType);
            regOpnd->SetValueType(vType);
        }

        }
        if (regOpnd)
        {
            instr->SetSrc1(regOpnd);
        }
        AddInstr(instr, offset);
        break;

    case Js::OpCodeAsmJs::Label:
        // NOP
        break;

    default:
        Assume(UNREACHED);
    }
}